

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

vocwdef * vocfnw(voccxdef *voccx,vocseadef *search_ctx)

{
  bool bVar1;
  int iVar2;
  undefined8 *in_RSI;
  long in_RDI;
  int first;
  vocdef *c;
  vocwdef *vwf;
  vocwdef *vw;
  vocdef *vf;
  vocdef *v;
  uint *local_98;
  uint *local_80;
  uint *local_68;
  uint *local_48;
  uint *local_30;
  uint *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  
  local_18 = (undefined8 *)*in_RSI;
  bVar1 = true;
  if (*(int *)in_RSI[1] == -1) {
    local_48 = (uint *)0x0;
  }
  else {
    local_48 = (uint *)(*(long *)(in_RDI + 0xe70 + ((ulong)*(uint *)in_RSI[1] / 2000) * 8) +
                       ((ulong)*(uint *)in_RSI[1] % 2000) * 8);
  }
  local_28 = local_48;
  local_20 = (undefined8 *)0x0;
  do {
    if (local_18 == (undefined8 *)0x0 || local_20 != (undefined8 *)0x0) {
      *in_RSI = local_20;
      if (local_20 == (undefined8 *)0x0) {
        local_98 = (uint *)0x0;
      }
      else {
        local_98 = local_30;
      }
      in_RSI[1] = local_98;
      return (vocwdef *)in_RSI[1];
    }
    if ((bVar1) ||
       ((iVar2 = voceq((uchar *)in_RSI[2],*(uint *)(in_RSI + 3),(uchar *)(local_18 + 2),
                       (uint)*(byte *)(local_18 + 1)), iVar2 != 0 &&
        (iVar2 = voceq((uchar *)in_RSI[4],*(uint *)(in_RSI + 5),
                       (uchar *)((long)local_18 + (long)(int)(uint)*(byte *)(local_18 + 1) + 0x10),
                       (uint)*(byte *)((long)local_18 + 9)), iVar2 != 0)))) {
      if (!bVar1) {
        if (*(int *)((long)local_18 + 0xc) == -1) {
          local_68 = (uint *)0x0;
        }
        else {
          local_68 = (uint *)(*(long *)(in_RDI + 0xe70 +
                                       ((ulong)*(uint *)((long)local_18 + 0xc) / 2000) * 8) +
                             ((ulong)*(uint *)((long)local_18 + 0xc) % 2000) * 8);
        }
        local_28 = local_68;
      }
      while (local_28 != (uint *)0x0) {
        if (((*(char *)(in_RSI[1] + 6) == *(char *)((long)local_28 + 6)) &&
            ((*(byte *)((long)local_28 + 7) & 1) == 0)) &&
           ((*(byte *)((long)local_28 + 7) & 8) == 0)) {
          local_20 = local_18;
          local_30 = local_28;
          break;
        }
        if (*local_28 == 0xffffffff) {
          local_80 = (uint *)0x0;
        }
        else {
          local_80 = (uint *)(*(long *)(in_RDI + 0xe70 + ((ulong)*local_28 / 2000) * 8) +
                             ((ulong)*local_28 % 2000) * 8);
        }
        local_28 = local_80;
      }
    }
    local_18 = (undefined8 *)*local_18;
    bVar1 = false;
  } while( true );
}

Assistant:

vocwdef *vocfnw(voccxdef *voccx, vocseadef *search_ctx)
{
    vocdef  *v, *vf;
    vocwdef *vw, *vwf;
    vocdef  *c = search_ctx->v;
    int      first;

    /* continue with current word's vocwdef list if anything is left */
    first = TRUE;
    vw = vocwget(voccx, search_ctx->vw->vocwnxt);

    /* keep going until we run out of hash chain entries or find a match */
    for (v = c, vf = 0 ; v != 0 && vf == 0 ; v = v->vocnxt, first = FALSE)
    {
        /* if this word matches, look at the objects in its list */
        if (first
            || (voceq(search_ctx->wrd1, search_ctx->len1,
                      v->voctxt, v->voclen)
                && voceq(search_ctx->wrd2, search_ctx->len2,
                         v->voctxt + v->voclen, v->vocln2)))
        {
            /*
             *   on the first time through, vw has already been set up
             *   with the next vocwdef in the current list; on subsequent
             *   times through the loop, start at the head of the current
             *   word's list 
             */
            if (!first)
                vw = vocwget(voccx, v->vocwlst);

            /* search the list from vw forward */
            for ( ; vw ; vw = vocwget(voccx, vw->vocwnxt))
            {
                if (search_ctx->vw->vocwtyp == vw->vocwtyp
                    && !(vw->vocwflg & VOCFCLASS)
                    && !(vw->vocwflg & VOCFDEL))
                {
                    /*
                     *   remember the first vocdef that we found, and
                     *   remember this, the first matching vocwdef, then
                     *   stop scanning 
                     */
                    vf = v;
                    vwf = vw;
                    break;
                }
            }
        }
    }

    /* return the first vocwdef in this word's list */
    search_ctx->v = vf;
    search_ctx->vw = (vf ? vwf : 0);
    return(search_ctx->vw);
}